

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ptr<std::vector<ptr<log_entry>_>_> __thiscall
nuraft::inmem_log_store::log_entries(inmem_log_store *this,ulong start,ulong end)

{
  size_type __n;
  bool bVar1;
  iterator entry_00;
  element_type *this_00;
  ulong in_RCX;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *in_RSI;
  element_type *in_RDI;
  ptr<std::vector<ptr<log_entry>_>_> pVar3;
  iterator entry;
  lock_guard<std::mutex> l;
  ptr<log_entry> src;
  ulong ii;
  ulong cc;
  ptr<std::vector<ptr<log_entry>_>_> *ret;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffff38;
  __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff40;
  _Self local_70;
  __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  local_58 [16];
  ulong local_48;
  size_type local_40;
  undefined1 local_21;
  ulong local_20;
  ulong local_18;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  cs_new<std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>
            ();
  std::
  __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x22ad68);
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  resize(in_RSI,(size_type)in_RDI);
  local_40 = 0;
  _Var2._M_pi = extraout_RDX;
  for (local_48 = local_18; local_48 < local_20; local_48 = local_48 + 1) {
    std::shared_ptr<nuraft::log_entry>::shared_ptr
              ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
    ;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff40,
               (mutex_type *)in_stack_ffffffffffffff38);
    entry_00 = std::
               map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
               ::find(in_stack_ffffffffffffff38,(key_type *)0x22adf0);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar1 = std::operator==((_Self *)&stack0xffffffffffffff98,&local_70);
    if (bVar1) {
      entry_00 = std::
                 map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                 ::find(in_stack_ffffffffffffff38,(key_type *)0x22ae48);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>
                *)0x22aec4);
    in_stack_ffffffffffffff40 = local_58;
    std::shared_ptr<nuraft::log_entry>::operator=
              ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff40,
               (shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff38);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22aee4);
    make_clone((ptr<log_entry> *)entry_00._M_node);
    this_00 = std::
              __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*(in_stack_ffffffffffffff40);
    __n = local_40;
    local_40 = local_40 + 1;
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[](this_00,__n);
    std::shared_ptr<nuraft::log_entry>::operator=
              ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff40,
               (shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff38);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x22af35);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x22af3f);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  pVar3.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ptr<std::vector<ptr<log_entry>_>_>)
         pVar3.
         super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< std::vector< ptr<log_entry> > >
    inmem_log_store::log_entries(ulong start, ulong end)
{
    ptr< std::vector< ptr<log_entry> > > ret =
        cs_new< std::vector< ptr<log_entry> > >();

    ret->resize(end - start);
    ulong cc=0;
    for (ulong ii = start ; ii < end ; ++ii) {
        ptr<log_entry> src = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            auto entry = logs_.find(ii);
            if (entry == logs_.end()) {
                entry = logs_.find(0);
                assert(0);
            }
            src = entry->second;
        }
        (*ret)[cc++] = make_clone(src);
    }
    return ret;
}